

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O3

void __thiscall
instrumentation::anon_unknown_0::prom_collector::write_<double>
          (prom_collector *this,metric_name *name,tags *t,double *v,char *metric_type)

{
  long *plVar1;
  double dVar2;
  _Alloc_hider _Var3;
  byte bVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  string pm_name;
  string local_48;
  
  (anonymous_namespace)::prom_collector::prom_metric_name_abi_cxx11_
            (&local_48,(prom_collector *)name,(metric_name *)t);
  if ((this->pending_help).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    bVar4 = 1;
    if ((this->pending_help).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length != 0) {
      poVar5 = this->out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# HELP ",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->pending_help).
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p,
                          (this->pending_help).
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar4 = (this->pending_help).
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged;
    }
    if ((bVar4 & 1) != 0) {
      (this->pending_help).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      _Var3._M_p = (this->pending_help).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      plVar1 = (long *)((long)&(this->pending_help).
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10);
      if ((long *)_Var3._M_p != plVar1) {
        operator_delete(_Var3._M_p,*plVar1 + 1);
      }
    }
    poVar5 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# TYPE ",7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    if (metric_type == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar6 = strlen(metric_type);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,metric_type,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  write_tags_(this,(tags *)(t->tags_)._M_h._M_before_begin._M_nxt);
  dVar2 = *v;
  if (NAN(dVar2)) {
    poVar5 = this->out;
    lVar7 = 5;
    pcVar8 = "\"NaN\"";
  }
  else {
    poVar5 = this->out;
    if (ABS(dVar2) != INFINITY) {
      std::ostream::_M_insert<double>(dVar2);
      goto LAB_0011b059;
    }
    pcVar8 = "+Inf";
    if (dVar2 < 0.0) {
      pcVar8 = "-Inf";
    }
    lVar7 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
LAB_0011b059:
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void write_(const metric_name& name, const tags& t, const T& v, const char* metric_type = "untyped") {
    const auto pm_name = prom_metric_name(name);

    if (pending_help) {
      if (!pending_help->empty())
        out << "# HELP " << pm_name << " " << *pending_help << "\n";
      pending_help.reset();
      out << "# TYPE " << pm_name << " " << metric_type << "\n";
    }

    out << pm_name << "\t";
    write_tags_(t);

    if constexpr(std::is_floating_point_v<T>) {
      // For floating point, ensure we handle the edge cases correctly.
      if (std::isnan(v)) {
        out << R"("NaN")";
      } else if (std::isinf(v)) {
        out << (v < 0 ? R"(-Inf)" : R"(+Inf)");
      } else {
        out << v;
      }
    } else {
      out << v;
    }

    out << "\n";
  }